

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vFfPerm_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vFfPerm);
  iVar2 = Gia_ManRegNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x35e,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCi(p,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar3 = Gia_ManAppendCi(p_00);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_28 = Gia_ManCi(p,iVar1 + local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar3 = Gia_ManAppendCi(p_00);
    iVar1 = Vec_IntEntry(vFfPerm,local_2c);
    pGVar5 = Gia_ManRo(p,iVar1);
    pGVar5->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    bVar6 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar2 = Gia_ObjFanin1Copy(pGStack_28);
      uVar3 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
      pGStack_28->Value = uVar3;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar6 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar3 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pGStack_28 = Gia_ManCo(p,iVar1 + local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Vec_IntEntry(vFfPerm,local_2c);
    pGVar5 = Gia_ManRi(p,iVar1);
    iVar1 = Gia_ObjFanin0Copy(pGVar5);
    uVar3 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    //Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    //vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        //Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
        Gia_ManRo(p, Vec_IntEntry(vFfPerm, i))->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        //pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vFfPerm, i)) ) );
    //Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}